

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityWriter::write
          (HttpFixedLengthEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  HttpEntityBodyWriter *this_00;
  bool bVar1;
  undefined8 *puVar2;
  Coroutine<void> *this_01;
  ArrayPtr<const_unsigned_char> *pAVar3;
  size_t sVar4;
  HttpOutputStream *pHVar5;
  Promise<void> *promise;
  ulong uVar6;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *this_02;
  suspend_never *this_03;
  unsigned_long *value;
  PromiseAwaiter<void> *__return_storage_ptr__;
  HttpOutputStream *this_04;
  suspend_always *this_05;
  SourceLocation *__n_00;
  unsigned_long *__n_01;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int __fd_00;
  undefined4 in_register_00000034;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  int local_588;
  Fault local_2f0;
  Fault f;
  undefined1 local_2e0 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  ArrayPtr<const_unsigned_char> *piece;
  ArrayPtr<const_unsigned_char> *__end2;
  ArrayPtr<const_unsigned_char> *__begin2;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *__range2;
  HttpFixedLengthEntityWriter *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  puVar2 = (undefined8 *)operator_new(0x440);
  *puVar2 = write;
  puVar2[1] = write;
  this_02 = (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)(puVar2 + 0x81);
  __n_00 = (SourceLocation *)(puVar2 + 0x7e);
  this_03 = (suspend_never *)((long)puVar2 + 0x43d);
  value = puVar2 + 0x84;
  __return_storage_ptr__ = (PromiseAwaiter<void> *)(puVar2 + 0x47);
  this_04 = (HttpOutputStream *)(puVar2 + 0x85);
  this_05 = (suspend_always *)((long)puVar2 + 0x43e);
  this_01 = (Coroutine<void> *)(puVar2 + 2);
  puVar2[0x86] = CONCAT44(in_register_00000034,__fd);
  this_02->ptr = (ArrayPtr<const_unsigned_char> *)__buf;
  puVar2[0x82] = __n;
  SourceLocation::SourceLocation
            (__n_00,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"write",0x9b1,0x11);
  kj::_::Coroutine<void>::Coroutine(this_01,*__n_00);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_01);
  bVar1 = std::__n4861::suspend_never::await_ready(this_03);
  __fd_00 = (int)puVar2;
  if (!bVar1) {
    *(undefined1 *)((long)puVar2 + 0x43c) = 0;
    _GLOBAL__N_1::HttpFixedLengthEntityWriter::write(this_03,__fd_00,__buf_00,(size_t)__n_00);
    return (ssize_t)this;
  }
  std::__n4861::suspend_never::await_resume(this_03);
  *value = 0;
  __n_01 = value;
  __end2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::begin(this_02);
  pAVar3 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::end(this_02);
  for (; __end2 != pAVar3; __end2 = __end2 + 1) {
    _kjCondition._32_8_ = __end2;
    sVar4 = ArrayPtr<const_unsigned_char>::size(__end2);
    __n_01 = (unsigned_long *)(sVar4 + *value);
    *value = (unsigned_long)__n_01;
  }
  if (*value == 0) {
    kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
              ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_01);
    local_588 = 3;
  }
  else {
    f.exception = (Exception *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,value);
    kj::_::DebugExpression<unsigned_long&>::operator<=
              ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_2e0,
               (DebugExpression<unsigned_long&> *)&f,(unsigned_long *)(puVar2[0x86] + 0x18));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2e0);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[25]>
                (&local_2f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x9b6,FAILED,"size <= length","_kjCondition,\"overwrote Content-Length\"",
                 (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_2e0,
                 (char (*) [25])"overwrote Content-Length");
      kj::_::Debug::Fault::fatal(&local_2f0);
    }
    this_00 = (HttpEntityBodyWriter *)puVar2[0x86];
    this_00[1].super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)((long)this_00[1].super_AsyncOutputStream._vptr_AsyncOutputStream - *value);
    pHVar5 = HttpEntityBodyWriter::getInner(this_00);
    __n_01 = (unsigned_long *)puVar2[0x82];
    pieces.size_ = (size_t)this_02->ptr;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)pHVar5;
    HttpOutputStream::writeBodyData(this_04,pieces);
    promise = kj::_::Coroutine<void>::await_transform<kj::Promise<void>>
                        (this_01,(Promise<void> *)this_04);
    co_await<void>(__return_storage_ptr__,promise);
    bVar1 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
    if (!bVar1) {
      *(undefined1 *)((long)puVar2 + 0x43c) = 1;
      uVar6 = _GLOBAL__N_1::HttpFixedLengthEntityWriter::write
                        (__return_storage_ptr__,__fd_00,__buf_01,(size_t)__n_01);
      if ((uVar6 & 1) != 0) {
        return (ssize_t)this;
      }
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
    Promise<void>::~Promise((Promise<void> *)this_04);
    if (*(long *)(puVar2[0x86] + 0x18) == 0) {
      HttpEntityBodyWriter::doneWriting((HttpEntityBodyWriter *)puVar2[0x86]);
    }
    local_588 = 0;
  }
  if (local_588 == 0) {
    kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
              ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_01);
  }
  else {
    __n_01 = (unsigned_long *)(ulong)(local_588 - 3U);
    if (local_588 - 3U != 0) goto LAB_00725be4;
  }
  kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_01);
  bVar1 = std::__n4861::suspend_always::await_ready(this_05);
  if (!bVar1) {
    *puVar2 = 0;
    *(undefined1 *)((long)puVar2 + 0x43c) = 2;
    _GLOBAL__N_1::HttpFixedLengthEntityWriter::write(this_05,__fd_00,__buf_02,(size_t)__n_01);
    return (ssize_t)this;
  }
  std::__n4861::suspend_always::await_resume(this_05);
LAB_00725be4:
  kj::_::Coroutine<void>::~Coroutine(this_01);
  if (puVar2 != (undefined8 *)0x0) {
    operator_delete(puVar2,0x440);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    uint64_t size = 0;
    for (auto& piece: pieces) size += piece.size();

    if (size == 0) co_return;
    KJ_REQUIRE(size <= length, "overwrote Content-Length");
    length -= size;

    co_await getInner().writeBodyData(pieces);
    if (length == 0) doneWriting();
  }